

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

void __thiscall ImBitArray<132,_0>::SetBitRange(ImBitArray<132,_0> *this,int n,int n2)

{
  sbyte sVar1;
  
  if (n < n2) {
    do {
      sVar1 = ((byte)(n2 + -1) & 0x1f) + 1;
      if ((int)(n | 0x1fU) < n2 + -1) {
        sVar1 = 0x20;
      }
      this->Storage[n >> 5] =
           this->Storage[n >> 5] | (~(uint)(-1L << sVar1) >> ((byte)n & 0x1f)) << ((byte)n & 0x1f);
      n = (n & 0xffffffe0U) + 0x20;
    } while (n < n2);
  }
  return;
}

Assistant:

inline void     ImBitArraySetBitRange(ImU32* arr, int n, int n2) // Works on range [n..n2)
{
    n2--;
    while (n <= n2)
    {
        int a_mod = (n & 31);
        int b_mod = (n2 > (n | 31) ? 31 : (n2 & 31)) + 1;
        ImU32 mask = (ImU32)(((ImU64)1 << b_mod) - 1) & ~(ImU32)(((ImU64)1 << a_mod) - 1);
        arr[n >> 5] |= mask;
        n = (n + 32) & ~31;
    }
}